

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QThreadPoolThread_*>::reallocate
          (QPodArrayOps<QThreadPoolThread_*> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QThreadPoolThread_*>_*,_QThreadPoolThread_**> pVar1;
  
  pVar1 = QTypedArrayData<QThreadPoolThread_*>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QThreadPoolThread_*>).d,
                     (this->super_QArrayDataPointer<QThreadPoolThread_*>).ptr,alloc,option);
  if (pVar1.second != (QThreadPoolThread **)0x0) {
    (this->super_QArrayDataPointer<QThreadPoolThread_*>).d = pVar1.first;
    (this->super_QArrayDataPointer<QThreadPoolThread_*>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }